

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O1

void __thiscall proto3_unittest::TestHasbits::Clear(TestHasbits *this)

{
  uint uVar1;
  TestAllTypes *this_00;
  LogMessageFatal LStack_18;
  
  uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((char)uVar1 != '\0') {
    *(undefined8 *)((long)&this->field_0 + 0x10) = 0;
  }
  if ((uVar1 & 0xff00) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
  }
  if ((uVar1 & 0xff0000) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x20) = 0;
  }
  if (0xffffff < uVar1) {
    *(undefined4 *)((long)&this->field_0 + 0x2b) = 0;
    *(undefined4 *)((long)&this->field_0 + 0x28) = 0;
    if ((int)uVar1 < 0) {
      this_00 = (this->field_0)._impl_.child_;
      if (this_00 == (TestAllTypes *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_proto3.pb.cc"
                   ,0x17dd,"_impl_.child_ != nullptr");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
      }
      TestAllTypes::Clear(this_00);
    }
  }
  uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[1];
  if ((char)uVar1 != '\0') {
    *(undefined8 *)((long)&this->field_0 + 0x38) = 0;
  }
  if ((uVar1 & 0xff00) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x40) = 0;
  }
  if ((uVar1 & 0xff0000) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x48) = 0;
  }
  if (0xffffff < uVar1) {
    *(undefined8 *)((long)&this->field_0 + 0x50) = 0;
  }
  if ((undefined1  [96])((undefined1  [96])this->field_0 & (undefined1  [96])0x3f) !=
      (undefined1  [96])0x0) {
    *(undefined2 *)((long)&this->field_0 + 0x5c) = 0;
    *(undefined4 *)((long)&this->field_0 + 0x58) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[2] = 0;
  *(undefined8 *)&this->field_0 = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestHasbits::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_unittest.TestHasbits)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.b1_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b8_) -
        reinterpret_cast<char*>(&_impl_.b1_)) + sizeof(_impl_.b8_));
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    ::memset(&_impl_.b9_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b16_) -
        reinterpret_cast<char*>(&_impl_.b9_)) + sizeof(_impl_.b16_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.b17_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b24_) -
        reinterpret_cast<char*>(&_impl_.b17_)) + sizeof(_impl_.b24_));
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    ::memset(&_impl_.b25_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b31_) -
        reinterpret_cast<char*>(&_impl_.b25_)) + sizeof(_impl_.b31_));
    if ((cached_has_bits & 0x80000000u) != 0) {
      ABSL_DCHECK(_impl_.child_ != nullptr);
      _impl_.child_->Clear();
    }
  }
  cached_has_bits = _impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.b32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b39_) -
        reinterpret_cast<char*>(&_impl_.b32_)) + sizeof(_impl_.b39_));
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    ::memset(&_impl_.b40_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b47_) -
        reinterpret_cast<char*>(&_impl_.b40_)) + sizeof(_impl_.b47_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.b48_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b55_) -
        reinterpret_cast<char*>(&_impl_.b48_)) + sizeof(_impl_.b55_));
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    ::memset(&_impl_.b56_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b63_) -
        reinterpret_cast<char*>(&_impl_.b56_)) + sizeof(_impl_.b63_));
  }
  cached_has_bits = _impl_._has_bits_[2];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    ::memset(&_impl_.b64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.b69_) -
        reinterpret_cast<char*>(&_impl_.b64_)) + sizeof(_impl_.b69_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}